

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O0

void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *ws)

{
  ZSTD_cwksp *ws_local;
  
  if (ws->tableValidEnd < ws->objectEnd) {
    __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                  ,0x22a,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
  }
  if (ws->tableValidEnd <= ws->allocStart) {
    if (ws->tableValidEnd < ws->tableEnd) {
      ws->tableValidEnd = ws->tableEnd;
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
    return;
  }
  __assert_fail("ws->tableValidEnd <= ws->allocStart",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                ,0x22b,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
}

Assistant:

MEM_STATIC void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp* ws) {
    DEBUGLOG(4, "cwksp: ZSTD_cwksp_mark_tables_clean");
    assert(ws->tableValidEnd >= ws->objectEnd);
    assert(ws->tableValidEnd <= ws->allocStart);
    if (ws->tableValidEnd < ws->tableEnd) {
        ws->tableValidEnd = ws->tableEnd;
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
}